

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

texts * lest::tags(texts *__return_storage_ptr__,text *name,texts *result)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  text local_88 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  size_type local_38;
  size_type rb;
  size_type lb;
  size_type none;
  texts *result_local;
  text *name_local;
  
  lb = 0xffffffffffffffff;
  none = (size_type)result;
  result_local = (texts *)name;
  name_local = (text *)__return_storage_ptr__;
  rb = std::__cxx11::string::find_first_of((char *)name,0x1521ef);
  local_38 = std::__cxx11::string::find_first_of((char *)name,0x1514cd);
  if ((rb == lb) || (local_38 == lb)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__,result);
  }
  else {
    std::__cxx11::string::substr((ulong)local_58,(ulong)name);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)result,local_58)
    ;
    std::__cxx11::string::~string((string *)local_58);
    std::__cxx11::string::substr((ulong)local_88,(ulong)name);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_a0,result);
    tags(__return_storage_ptr__,local_88,&local_a0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a0);
    std::__cxx11::string::~string((string *)local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

inline texts tags( text name, texts result = {} )
{
    auto none = std::string::npos;
    auto lb   = name.find_first_of( "[" );
    auto rb   = name.find_first_of( "]" );

    if ( lb == none || rb == none )
        return result;

    result.emplace_back( name.substr( lb, rb - lb + 1 ) );

    return tags( name.substr( rb + 1 ), result );
}